

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absolute.cpp
# Opt level: O3

string * fs_absolute_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,string_view base,
                   bool expand_tilde)

{
  string_view path_00;
  bool bVar1;
  undefined3 in_register_00000089;
  string ex;
  _Alloc_hider in_stack_ffffffffffffff98;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  if (CONCAT31(in_register_00000089,expand_tilde) == 0) {
    in_stack_ffffffffffffff98._M_p = (pointer)&local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff98,path._M_str,path._M_str + path._M_len);
  }
  else {
    fs_expanduser_abi_cxx11_((string *)&stack0xffffffffffffff98,path);
  }
  if (path._M_len == 0 || local_60 != 0) {
    path_00._M_str = in_stack_ffffffffffffff98._M_p;
    path_00._M_len = 0x10e654;
    bVar1 = fs_is_absolute(path_00);
    if (bVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,in_stack_ffffffffffffff98._M_p,
                 in_stack_ffffffffffffff98._M_p + local_60);
    }
    else {
      fs_absolute_abi_cxx11_(&local_48,base,expand_tilde);
      if (local_48._M_string_length == 0) {
        fs_absolute_abi_cxx11_();
      }
      else {
        if (local_60 != 0) {
          if (local_48._M_dataplus._M_p[local_48._M_string_length - 1] != '/') {
            std::__cxx11::string::push_back((char)&local_48);
          }
          std::__cxx11::string::_M_append((char *)&local_48,(ulong)in_stack_ffffffffffffff98._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == &local_48.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_48.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_48.field_2._M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = local_48._M_string_length;
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff98._M_p != &local_58) {
    operator_delete(in_stack_ffffffffffffff98._M_p,local_58._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_absolute(std::string_view path, std::string_view base, const bool expand_tilde)
{
  // rebase path on base.

  const std::string ex = expand_tilde
    ? fs_expanduser(path)
    : std::string(path);

  if (ex.empty() && !path.empty()) FFS_UNLIKELY
    return {};

  if(fs_is_absolute(ex))
    return ex;

  std::string b = fs_absolute(base, expand_tilde);
  if(b.empty())  FFS_UNLIKELY
    return {};

  if(!ex.empty()){
    if(b.back() != '/')
      b.push_back('/');

    // don't need join(). Keeps it like Python pathlib.Path.absolute()
    b.append(ex);
  }

  return b;
}